

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

void duckdb::MedianAbsoluteDeviationOperation<short>::
     Finalize<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,short *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  short sVar2;
  reference n_p;
  short *in_RSI;
  vector<short,_std::allocator<short>_> *in_RDI;
  MadAccessor<short,_short,_short> accessor;
  short med;
  Interpolator<false> interp;
  value_type *q;
  QuantileBindData *bind_data;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  FunctionData *in_stack_ffffffffffffff90;
  MadAccessor<short,_short,_short> in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  short in_stack_ffffffffffffffa6;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  bVar1 = std::vector<short,_std::allocator<short>_>::empty
                    ((vector<short,_std::allocator<short>_> *)
                     CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0));
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90);
    FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffff90);
    n_p = vector<duckdb::QuantileValue,_true>::operator[]
                    ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff90,
                     CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::vector<short,_std::allocator<short>_>::size(in_RDI);
    Interpolator<false>::Interpolator
              ((Interpolator<false> *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),
               (QuantileValue *)in_stack_ffffffffffffff98.median,(idx_t)n_p,
               (bool)in_stack_ffffffffffffff8f);
    std::vector<short,_std::allocator<short>_>::data
              ((vector<short,_std::allocator<short>_> *)0xad08c6);
    Interpolator<false>::Operation<short,short,duckdb::QuantileDirect<short>>
              ((Interpolator<false> *)interp.CRN,(short *)interp.FRN,(Vector *)interp.RN,
               (QuantileDirect<short> *)interp._0_8_);
    MadAccessor<short,_short,_short>::MadAccessor
              ((MadAccessor<short,_short,_short> *)&stack0xffffffffffffff98,
               (short *)&stack0xffffffffffffffa6);
    std::vector<short,_std::allocator<short>_>::data
              ((vector<short,_std::allocator<short>_> *)0xad08fe);
    sVar2 = Interpolator<false>::Operation<short,short,duckdb::MadAccessor<short,short,short>>
                      ((Interpolator<false> *)interp.CRN,(short *)interp.FRN,(Vector *)interp.RN,
                       (MadAccessor<short,_short,_short> *)interp._0_8_);
    *in_RSI = sVar2;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}